

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::PriceField::PriceField(PriceField *this,PriceField *to_copy)

{
  Type TVar1;
  string *this_00;
  
  TVar1 = to_copy->type_;
  this->type_ = TVar1;
  switch(TVar1) {
  case INTEGER:
    (this->field_1).int_value_ = (to_copy->field_1).int_value_;
    break;
  case LONG:
    this->field_1 = to_copy->field_1;
    break;
  case DOUBLE:
    this->field_1 = to_copy->field_1;
    break;
  case STRING:
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,(string *)(to_copy->field_1).string_value_);
    (this->field_1).string_value_ = this_00;
  }
  return;
}

Assistant:

PriceField::PriceField(const PriceField &to_copy) : type_(to_copy.type_)
{
    switch(type_)
    {
        case INTEGER:
            int_value_ = to_copy.int_value_;
            break;
        case LONG:
            long_value_ = to_copy.long_value_;
            break;
        case DOUBLE:
            double_value_ = to_copy.double_value_;
            break;
        case STRING:
            string_value_ = new std::string(*to_copy.string_value_);
            break;
        case NOTHING:
            break;
    }
}